

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTempor.c
# Opt level: O2

Aig_Man_t * Saig_ManTemporFrames(Aig_Man_t *pAig,int nFrames)

{
  Aig_Man_t *p;
  char *pcVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  void *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  Aig_ManCleanData(pAig);
  p = Aig_ManStart(pAig->vObjs->nSize * nFrames);
  pcVar1 = Abc_UtilStrsav(pAig->pName);
  p->pName = pcVar1;
  for (iVar6 = 0; iVar8 = pAig->nRegs, iVar6 < iVar8; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar6);
    *(ulong *)((long)pvVar2 + 0x28) = (ulong)p->pConst1 ^ 1;
  }
  iVar6 = 0;
  if (nFrames < 1) {
    nFrames = 0;
  }
  for (; iVar6 != nFrames; iVar6 = iVar6 + 1) {
    pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
    for (iVar8 = 0; iVar8 < pAig->nTruePis; iVar8 = iVar8 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCis,iVar8);
      pAVar3 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
    }
    for (iVar8 = 0; iVar8 < pAig->vObjs->nSize; iVar8 = iVar8 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar8);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        pAVar4 = Aig_ObjChild0Copy(pAVar3);
        p1 = Aig_ObjChild1Copy(pAVar3);
        pAVar4 = Aig_And(p,pAVar4,p1);
        (pAVar3->field_5).pData = pAVar4;
      }
    }
    for (iVar8 = 0; iVar8 < pAig->vCos->nSize; iVar8 = iVar8 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar8);
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      (pAVar3->field_5).pData = pAVar4;
    }
    for (iVar7 = 0; iVar8 = pAig->nRegs, iVar7 < iVar8; iVar7 = iVar7 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar7);
      pvVar5 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar7);
      *(undefined8 *)((long)pvVar5 + 0x28) = *(undefined8 *)((long)pvVar2 + 0x28);
    }
  }
  for (iVar6 = 0; iVar6 < iVar8; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar6);
    Aig_ObjCreateCo(p,*(Aig_Obj_t **)((long)pvVar2 + 0x28));
    iVar8 = pAig->nRegs;
  }
  Aig_ManCleanup(p);
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates initialized timeframes for temporal decomposition.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Saig_ManTemporFrames( Aig_Man_t * pAig, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
    // start the frames package
    Aig_ManCleanData( pAig );
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    // initiliaze the flops
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_ManConst0(pFrames);
    // for each timeframe
    for ( f = 0; f < nFrames; f++ )
    {
        Aig_ManConst1(pAig)->pData = Aig_ManConst1(pFrames);
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi(pFrames);
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        Aig_ManForEachCo( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
            pObjLo->pData = pObjLi->pData;
    }
    // create POs for the flop inputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pFrames, (Aig_Obj_t *)pObj->pData );
    Aig_ManCleanup( pFrames );
    return pFrames;
}